

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O1

bool __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert_internal
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k,value_type v)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    bVar1 = db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert_internal
                      (&this->db_,(art_key_type)k.field_0,v);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

[[nodiscard]] auto insert_internal(art_key_type k, value_type v) {
    const std::lock_guard guard{mutex};
    return db_.insert_internal(k, v);
  }